

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket_acceptor.hpp
# Opt level: O3

void __thiscall
asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::cancel
          (basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *this)

{
  int iVar1;
  error_code __ec;
  error_code local_38;
  system_error local_28 [32];
  
  local_38._M_value = 0;
  local_38._M_cat = (error_category *)std::_V2::system_category();
  iVar1 = (this->impl_).implementation_.super_base_implementation_type.socket_;
  if (iVar1 != -1) {
    detail::epoll_reactor::cancel_ops
              ((((this->impl_).service_)->super_reactive_socket_service_base).reactor_,iVar1,
               &(this->impl_).implementation_.super_base_implementation_type.reactor_data_);
    return;
  }
  std::error_code::operator=(&local_38,bad_descriptor);
  __ec._4_4_ = 0;
  __ec._M_value = local_38._M_value;
  if (local_38._M_value != 0) {
    __ec._M_cat = local_38._M_cat;
    std::system_error::system_error(local_28,__ec,"cancel");
    detail::throw_exception<std::system_error>(local_28);
    std::system_error::~system_error(local_28);
  }
  return;
}

Assistant:

void cancel()
  {
    asio::error_code ec;
    impl_.get_service().cancel(impl_.get_implementation(), ec);
    asio::detail::throw_error(ec, "cancel");
  }